

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadCst<int>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>
::dx(FadBinaryMul<FadCst<int>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>
     *this,int i)

{
  value_type vVar1;
  
  vVar1 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>
          ::dx(&this->right_->fadexpr_,i);
  return vVar1 * (double)(this->left_).constant_;
}

Assistant:

const value_type dx(int i) const {return  right_.dx(i) * left_.val();}